

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int SaveMultiChannelEXRToFile(EXRImage *exrImage,char *filename,char **err)

{
  FILE *__s;
  size_t __n;
  char *pcVar1;
  uchar *mem;
  uchar *local_28;
  
  if (exrImage == (EXRImage *)0x0 || filename == (char *)0x0) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar1 = "Invalid argument.";
  }
  else {
    __s = fopen(filename,"wb");
    if (__s != (FILE *)0x0) {
      local_28 = (uchar *)0x0;
      __n = SaveMultiChannelEXRToMemory(exrImage,&local_28,err);
      if (local_28 != (uchar *)0x0 && __n != 0) {
        fwrite(local_28,1,__n,__s);
      }
      free(local_28);
      fclose(__s);
      return 0;
    }
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar1 = "Cannot write a file.";
  }
  *err = pcVar1;
  return -1;
}

Assistant:

int SaveMultiChannelEXRToFile(const EXRImage *exrImage, const char *filename,
                              const char **err) {
  if (exrImage == NULL || filename == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  FILE *fp = fopen(filename, "wb");
  if (!fp) {
    if (err) {
      (*err) = "Cannot write a file.";
    }
    return -1;
  }

  unsigned char *mem = NULL;
  size_t mem_size = SaveMultiChannelEXRToMemory(exrImage, &mem, err);

  if ((mem_size > 0) && mem) {

    fwrite(mem, 1, mem_size, fp);
  }
  free(mem);

  fclose(fp);

  return 0; // OK
}